

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpTools.cpp
# Opt level: O0

void __thiscall UdpTools::UdpTools(UdpTools *this,string *iface)

{
  bool bVar1;
  int iVar2;
  pointer pbVar3;
  undefined8 uVar4;
  invalid_argument *this_00;
  _Self local_78;
  _List_node_base *local_70;
  _List_node_base *local_68;
  _Self local_60;
  _List_node_base *local_58;
  byte local_49;
  iterator iStack_48;
  bool ifacefound;
  iterator it;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfacesOnSystem;
  string *iface_local;
  UdpTools *this_local;
  
  this->_vptr_UdpTools = (_func_int **)&PTR__UdpTools_00109d90;
  std::__cxx11::string::string((string *)&this->specifiedInterface);
  this->stopReceiveThread = false;
  std::__cxx11::string::operator=((string *)&this->specifiedInterface,(string *)iface);
  getInterfaces_abi_cxx11_
            ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&it,this);
  std::
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  _List_iterator(&stack0xffffffffffffffb8);
  local_49 = 0;
  local_58 = (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&it);
  iStack_48 = (iterator)local_58;
  do {
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it);
    bVar1 = std::operator!=(&stack0xffffffffffffffb8,&local_60);
    if (!bVar1) {
LAB_00105113:
      if ((local_49 & 1) != 0) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it);
        return;
      }
      uVar4 = std::__cxx11::string::c_str();
      printf("Given interface name %s was not found!\n",uVar4);
      printf("Detected interfaces: ");
      local_70 = (_List_node_base *)
                 std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&it);
      iStack_48 = (iterator)local_70;
      while( true ) {
        local_78._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&it);
        bVar1 = std::operator!=(&stack0xffffffffffffffb8,&local_78);
        if (!bVar1) break;
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator->(&stack0xffffffffffffffb8);
        std::__cxx11::string::c_str();
        printf("\t\t %s\n");
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&stack0xffffffffffffffb8,0);
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Could not detect iface name");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    pbVar3 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator->(&stack0xffffffffffffffb8);
    iVar2 = std::__cxx11::string::compare((string *)pbVar3);
    if (iVar2 == 0) {
      local_49 = 1;
      goto LAB_00105113;
    }
    local_68 = (_List_node_base *)
               std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(&stack0xffffffffffffffb8,0);
  } while( true );
}

Assistant:

UdpTools::UdpTools(std::string iface)
{
	stopReceiveThread = false;
	specifiedInterface = iface;
	std::list<std::string> interfacesOnSystem = getInterfaces();
	std::list<std::string>::iterator it;

	bool ifacefound = false;
	for(it = interfacesOnSystem.begin(); it != interfacesOnSystem.end(); it++)
	{
		if(it->compare(iface) == 0)
		{
			ifacefound = true;
			break;
		}
	}

	if(!ifacefound)
	{
		printf("Given interface name %s was not found!\n", iface.c_str());
		printf("Detected interfaces: ");
		for(it = interfacesOnSystem.begin(); it != interfacesOnSystem.end(); it++)
		{
			printf("\t\t %s\n", it->c_str());
		}
		throw std::invalid_argument("Could not detect iface name");
	}

}